

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void Curl_hash_clean(Curl_hash *h)

{
  Curl_hash_element *he_00;
  Curl_hash_element **he_anchor_00;
  ulong local_28;
  size_t i;
  Curl_hash_element **he_anchor;
  Curl_hash_element *he;
  Curl_hash *h_local;
  
  if ((h != (Curl_hash *)0x0) && (h->table != (Curl_hash_element **)0x0)) {
    for (local_28 = 0; local_28 < h->slots; local_28 = local_28 + 1) {
      he_anchor_00 = h->table + local_28;
      while (*he_anchor_00 != (Curl_hash_element *)0x0) {
        he_00 = *he_anchor_00;
        hash_elem_unlink(h,he_anchor_00,he_00);
        hash_elem_destroy(h,he_00);
      }
    }
  }
  return;
}

Assistant:

void Curl_hash_clean(struct Curl_hash *h)
{
  if(h && h->table) {
    struct Curl_hash_element *he, **he_anchor;
    size_t i;
    DEBUGASSERT(h->init == HASHINIT);
    for(i = 0; i < h->slots; ++i) {
      he_anchor = &h->table[i];
      while(*he_anchor) {
        he = *he_anchor;
        hash_elem_unlink(h, he_anchor, he);
        hash_elem_destroy(h, he);
      }
    }
  }
}